

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O3

Token * __thiscall
wabt::WastLexer::GetNumberToken(Token *__return_storage_ptr__,WastLexer *this,TokenType token_type)

{
  byte *pbVar1;
  bool bVar2;
  int iVar3;
  byte *pbVar4;
  byte *pbVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  
  bVar2 = ReadNum(this);
  if (bVar2) {
    pbVar5 = (byte *)this->buffer_end_;
    pbVar4 = (byte *)this->cursor_;
    if ((pbVar4 < pbVar5) && (*pbVar4 == 0x2e)) {
      pbVar4 = pbVar4 + 1;
      this->cursor_ = (char *)pbVar4;
      if (pbVar4 < pbVar5) {
        lVar8 = (ulong)*pbVar4 + 1;
      }
      else {
        lVar8 = 0;
      }
      token_type = First_Literal;
      if ((""[lVar8] & 8U) != 0) {
        bVar2 = ReadNum(this);
        if (!bVar2) goto LAB_0015e3bc;
        pbVar5 = (byte *)this->buffer_end_;
        pbVar4 = (byte *)this->cursor_;
      }
    }
    if ((pbVar4 < pbVar5) && ((*pbVar4 == 0x65 || (*pbVar4 == 0x45)))) {
      pbVar1 = pbVar4 + 1;
      this->cursor_ = (char *)pbVar1;
      if ((pbVar1 < pbVar5) && ((*pbVar1 == 0x2d || (*pbVar1 == 0x2b)))) {
        this->cursor_ = (char *)(pbVar4 + 2);
      }
      bVar2 = ReadNum(this);
      if (!bVar2) goto LAB_0015e3bc;
      pbVar5 = (byte *)this->buffer_end_;
      pbVar4 = (byte *)this->cursor_;
      token_type = First_Literal;
    }
    if (pbVar4 < pbVar5) {
      iVar3 = (int)pbVar4;
      iVar6 = 0;
      do {
        iVar7 = iVar6;
        if ((""[(ulong)*pbVar4 + 1] & 1U) == 0) break;
        pbVar4 = pbVar4 + 1;
        this->cursor_ = (char *)pbVar4;
        iVar6 = iVar6 + 1;
        iVar7 = (int)pbVar5 - iVar3;
      } while (pbVar4 != pbVar5);
      if (iVar7 != 0) goto LAB_0015e3bc;
    }
    bVar2 = token_type == First_Literal;
    if (bVar2) {
      token_type = First_Literal;
    }
    LiteralToken(__return_storage_ptr__,this,token_type,(uint)bVar2);
  }
  else {
LAB_0015e3bc:
    GetReservedToken(__return_storage_ptr__,this);
  }
  return __return_storage_ptr__;
}

Assistant:

Token WastLexer::GetNumberToken(TokenType token_type) {
  if (ReadNum()) {
    if (MatchChar('.')) {
      token_type = TokenType::Float;
      if (IsDigit(PeekChar()) && !ReadNum()) {
        return GetReservedToken();
      }
    }
    if (MatchChar('e') || MatchChar('E')) {
      token_type = TokenType::Float;
      ReadSign();
      if (!ReadNum()) {
        return GetReservedToken();
      }
    }
    if (NoTrailingReservedChars()) {
      if (token_type == TokenType::Float) {
        return LiteralToken(token_type, LiteralType::Float);
      } else {
        return LiteralToken(token_type, LiteralType::Int);
      }
    }
  }
  return GetReservedToken();
}